

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

int xmlDictGrow(xmlDictPtr dict,size_t size)

{
  _xmlDictEntry *p_Var1;
  size_t sVar2;
  _xmlDictEntry *p_Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  xmlChar *pxVar9;
  unsigned_long uVar10;
  uint32_t uVar11;
  _xmlDictEntry *p_Var12;
  unsigned_long uVar13;
  _xmlDictEntry *p_Var14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  size_t sVar18;
  ulong uVar19;
  unsigned_long *puVar20;
  size_t sVar21;
  bool bVar22;
  
  iVar17 = -1;
  if ((7 < size) && (p_Var1 = dict->dict, p_Var1 != (_xmlDictEntry *)0x0)) {
    sVar2 = dict->size;
    p_Var12 = (_xmlDictEntry *)(*xmlMalloc)(size << 5);
    dict->dict = p_Var12;
    if (p_Var12 == (_xmlDictEntry *)0x0) {
      dict->dict = p_Var1;
    }
    else {
      memset(p_Var12,0,size << 5);
      dict->size = size;
      puVar20 = &p_Var1->okey;
      sVar18 = sVar2;
      iVar17 = 0;
      while (bVar22 = sVar18 != 0, sVar18 = sVar18 - 1, bVar22) {
        iVar15 = iVar17;
        if (*(int *)((long)puVar20 + -4) != 0) {
          if (sVar2 == 0x80) {
            uVar19 = dict->size;
            if (uVar19 == 0x80) {
              uVar13 = xmlDictComputeFastKey
                                 ((xmlChar *)puVar20[-2],*(uint *)(puVar20 + -1),dict->seed);
              uVar19 = 0x80;
            }
            else {
              uVar11 = xmlDictComputeBigKey
                                 ((xmlChar *)puVar20[-2],*(uint *)(puVar20 + -1),dict->seed);
              uVar13 = (unsigned_long)uVar11;
            }
          }
          else {
            uVar13 = *puVar20;
            uVar19 = dict->size;
          }
          uVar19 = uVar13 % uVar19;
          if (dict->dict[uVar19].valid == 0) {
            p_Var14 = dict->dict + uVar19;
            p_Var12 = ((_xmlDictEntry *)(puVar20 + -3))->next;
            pxVar9 = (xmlChar *)puVar20[-2];
            uVar10 = *puVar20;
            *(unsigned_long *)&p_Var14->len = puVar20[-1];
            p_Var14->okey = uVar10;
            p_Var14->next = p_Var12;
            p_Var14->name = pxVar9;
            p_Var12 = dict->dict;
            p_Var12[uVar19].next = (_xmlDictEntry *)0x0;
            p_Var12[uVar19].okey = uVar13;
          }
          else {
            p_Var12 = (_xmlDictEntry *)(*xmlMalloc)(0x20);
            iVar15 = -1;
            if (p_Var12 != (_xmlDictEntry *)0x0) {
              p_Var12->name = (xmlChar *)puVar20[-2];
              p_Var12->len = *(uint *)(puVar20 + -1);
              p_Var12->okey = uVar13;
              p_Var14 = dict->dict;
              p_Var12->next = p_Var14[uVar19].next;
              p_Var12->valid = 1;
              p_Var14[uVar19].next = p_Var12;
              iVar15 = iVar17;
            }
          }
        }
        puVar20 = puVar20 + 4;
        iVar17 = iVar15;
      }
      for (sVar18 = 0; sVar18 != sVar2; sVar18 = sVar18 + 1) {
        p_Var12 = p_Var1[sVar18].next;
        while (p_Var12 != (_xmlDictEntry *)0x0) {
          p_Var14 = p_Var12->next;
          if (sVar2 == 0x80) {
            sVar21 = dict->size;
            if (sVar21 == 0x80) {
              uVar19 = xmlDictComputeFastKey(p_Var12->name,p_Var12->len,dict->seed);
              sVar21 = 0x80;
            }
            else {
              uVar11 = xmlDictComputeBigKey(p_Var12->name,p_Var12->len,dict->seed);
              uVar19 = (ulong)uVar11;
            }
          }
          else {
            uVar19 = p_Var12->okey;
            sVar21 = dict->size;
          }
          uVar16 = uVar19 % sVar21;
          p_Var3 = dict->dict + uVar16;
          if (dict->dict[uVar16].valid == 0) {
            uVar4 = *(undefined4 *)&p_Var12->next;
            uVar5 = *(undefined4 *)((long)&p_Var12->next + 4);
            uVar6 = *(undefined4 *)&p_Var12->name;
            uVar7 = *(undefined4 *)((long)&p_Var12->name + 4);
            iVar15 = p_Var12->valid;
            uVar13 = p_Var12->okey;
            uVar8 = *(undefined4 *)((long)&p_Var12->okey + 4);
            p_Var3->len = p_Var12->len;
            p_Var3->valid = iVar15;
            *(int *)&p_Var3->okey = (int)uVar13;
            *(undefined4 *)((long)&p_Var3->okey + 4) = uVar8;
            *(undefined4 *)&p_Var3->next = uVar4;
            *(undefined4 *)((long)&p_Var3->next + 4) = uVar5;
            *(undefined4 *)&p_Var3->name = uVar6;
            *(undefined4 *)((long)&p_Var3->name + 4) = uVar7;
            p_Var3 = dict->dict;
            p_Var3[uVar16].next = (_xmlDictEntry *)0x0;
            p_Var3[uVar16].valid = 1;
            p_Var3[uVar16].okey = uVar19;
            (*xmlFree)(p_Var12);
            p_Var12 = p_Var14;
          }
          else {
            p_Var12->next = p_Var3->next;
            p_Var12->okey = uVar19;
            p_Var3->next = p_Var12;
            p_Var12 = p_Var14;
          }
        }
      }
      (*xmlFree)(p_Var1);
    }
  }
  return iVar17;
}

Assistant:

static int
xmlDictGrow(xmlDictPtr dict, size_t size) {
    unsigned long key, okey;
    size_t oldsize, i;
    xmlDictEntryPtr iter, next;
    struct _xmlDictEntry *olddict;
#ifdef DEBUG_GROW
    unsigned long nbElem = 0;
#endif
    int ret = 0;
    int keep_keys = 1;

    if (dict == NULL)
	return(-1);
    if (size < 8)
        return(-1);
    if (size > 8 * 2048)
	return(-1);

#ifdef DICT_DEBUG_PATTERNS
    fprintf(stderr, "*");
#endif

    oldsize = dict->size;
    olddict = dict->dict;
    if (olddict == NULL)
        return(-1);
    if (oldsize == MIN_DICT_SIZE)
        keep_keys = 0;

    dict->dict = xmlMalloc(size * sizeof(xmlDictEntry));
    if (dict->dict == NULL) {
	dict->dict = olddict;
	return(-1);
    }
    memset(dict->dict, 0, size * sizeof(xmlDictEntry));
    dict->size = size;

    /*	If the two loops are merged, there would be situations where
	a new entry needs to allocated and data copied into it from
	the main dict. It is nicer to run through the array twice, first
	copying all the elements in the main array (less probability of
	allocate) and then the rest, so we only free in the second loop.
    */
    for (i = 0; i < oldsize; i++) {
	if (olddict[i].valid == 0)
	    continue;

	if (keep_keys)
	    okey = olddict[i].okey;
	else
	    okey = xmlDictComputeKey(dict, olddict[i].name, olddict[i].len);
	key = okey % dict->size;

	if (dict->dict[key].valid == 0) {
	    memcpy(&(dict->dict[key]), &(olddict[i]), sizeof(xmlDictEntry));
	    dict->dict[key].next = NULL;
	    dict->dict[key].okey = okey;
	} else {
	    xmlDictEntryPtr entry;

	    entry = xmlMalloc(sizeof(xmlDictEntry));
	    if (entry != NULL) {
		entry->name = olddict[i].name;
		entry->len = olddict[i].len;
		entry->okey = okey;
		entry->next = dict->dict[key].next;
		entry->valid = 1;
		dict->dict[key].next = entry;
	    } else {
	        /*
		 * we don't have much ways to alert from here
		 * result is losing an entry and unicity guarantee
		 */
	        ret = -1;
	    }
	}
#ifdef DEBUG_GROW
	nbElem++;
#endif
    }

    for (i = 0; i < oldsize; i++) {
	iter = olddict[i].next;
	while (iter) {
	    next = iter->next;

	    /*
	     * put back the entry in the new dict
	     */

	    if (keep_keys)
		okey = iter->okey;
	    else
		okey = xmlDictComputeKey(dict, iter->name, iter->len);
	    key = okey % dict->size;
	    if (dict->dict[key].valid == 0) {
		memcpy(&(dict->dict[key]), iter, sizeof(xmlDictEntry));
		dict->dict[key].next = NULL;
		dict->dict[key].valid = 1;
		dict->dict[key].okey = okey;
		xmlFree(iter);
	    } else {
		iter->next = dict->dict[key].next;
		iter->okey = okey;
		dict->dict[key].next = iter;
	    }

#ifdef DEBUG_GROW
	    nbElem++;
#endif

	    iter = next;
	}
    }

    xmlFree(olddict);

#ifdef DEBUG_GROW
    xmlGenericError(xmlGenericErrorContext,
	    "xmlDictGrow : from %lu to %lu, %u elems\n", oldsize, size, nbElem);
#endif

    return(ret);
}